

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogWrapper.cpp
# Opt level: O2

bool __thiscall
LogWrapper::WriteHex
          (LogWrapper *this,Location *location,int type,char *data,unsigned_short dataLen,
          char *format,...)

{
  char in_AL;
  bool bVar1;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  string str;
  undefined8 local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  string local_108;
  undefined1 local_e8 [48];
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  bVar1 = false;
  memset(this->m_buf,0,0x25800);
  local_128 = 0x3000000030;
  local_120 = &stack0x00000008;
  local_118 = local_e8;
  dd::Location::ToString_abi_cxx11_(&local_108,location);
  if (local_108._M_string_length < 0x25800) {
    bVar1 = false;
    sprintf(this->m_buf,"%s ",local_108._M_dataplus._M_p);
    vsnprintf(this->m_buf + local_108._M_string_length + 1,0x257ff - local_108._M_string_length,
              format,&local_128);
    this->m_buf[0x257ff] = '\0';
    if (s_writeHex != (FN_MLogWriteHex)0x0) {
      bVar1 = (*s_writeHex)(type,this->m_hLog,this->m_buf,data,dataLen);
    }
  }
  std::__cxx11::string::~string((string *)&local_108);
  return bVar1;
}

Assistant:

bool LogWrapper::WriteHex(dd::Location& location, int type,  const char *data, unsigned short dataLen, const char *format, ... )
{
	va_list args;
	memset(m_buf, 0, MAX_BUF_SIZE);
	va_start(args, format);
	std::string str = location.ToString();
	if (str.length() >= MAX_BUF_SIZE)
		return false;
	sprintf(m_buf, "%s ", str.c_str());
	vsnprintf(m_buf + str.length() + 1, MAX_BUF_SIZE - str.length() - 1, format, args);
	m_buf[MAX_BUF_SIZE - 1] = '\0';
	va_end(args);

	if(s_writeHex != NULL)
		return s_writeHex(type, m_hLog, m_buf, data, dataLen);
	return false;
}